

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O0

UBool uprv_isNegativeInfinity_63(double number)

{
  UBool UVar1;
  undefined1 local_11;
  double number_local;
  
  local_11 = false;
  if (number < 0.0) {
    UVar1 = uprv_isInfinite_63(number);
    local_11 = UVar1 != '\0';
  }
  return local_11;
}

Assistant:

U_CAPI UBool U_EXPORT2
uprv_isNegativeInfinity(double number)
{
#if IEEE_754 || U_PLATFORM == U_PF_OS390
    return (UBool)(number < 0 && uprv_isInfinite(number));

#else
    uint32_t highBits = *(uint32_t*)u_topNBytesOfDouble(&number,
                        sizeof(uint32_t));
    return((highBits & SIGN) && uprv_isInfinite(number));

#endif
}